

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MDLLoader.cpp
# Opt level: O1

void __thiscall Assimp::MDLImporter::SizeCheck(MDLImporter *this,void *szPos)

{
  runtime_error *this_00;
  undefined1 *local_40 [2];
  undefined1 local_30 [16];
  
  if ((szPos != (void *)0x0) && (szPos <= this->mBuffer + this->iFileSize)) {
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  local_40[0] = local_30;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_40,"Invalid MDL file. The file is too small or contains invalid data.",
             "");
  std::runtime_error::runtime_error(this_00,(string *)local_40);
  *(undefined ***)this_00 = &PTR__runtime_error_0081d260;
  __cxa_throw(this_00,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void MDLImporter::SizeCheck(const void* szPos)
{
    if (!szPos || (const unsigned char*)szPos > this->mBuffer + this->iFileSize)
    {
        throw DeadlyImportError("Invalid MDL file. The file is too small "
            "or contains invalid data.");
    }
}